

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void expandFormatArguments<char>(vector<String,_std::allocator<String>_> *data,char *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_type local_30;
  
  paVar1 = &local_30._string.field_2;
  local_30._string.field_2._M_allocated_capacity._0_2_ = ZEXT12((byte)*arg);
  local_30._string._M_string_length = 2;
  local_30._string.field_2._M_local_buf[2] = '\0';
  local_30._string._M_dataplus._M_p = (pointer)paVar1;
  std::vector<String,_std::allocator<String>_>::push_back(data,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._string._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._string._M_dataplus._M_p);
  }
  return;
}

Assistant:

FormatArgument (const T& a) :
		m_text (MakeFormatArgument (a)) {}